

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_runner_platform.c
# Opt level: O0

void stop(void)

{
  char *pcVar1;
  
  pcVar1 = getenv("CGREEN_CHILD_EXIT_WITH__EXIT");
  if (pcVar1 == (char *)0x0) {
    exit(0);
  }
  _exit(0);
}

Assistant:

static void stop(void) {
#ifdef CGREEN_INTERNAL_WITH_GCOV
    if (1)
#else
    if (getenv("CGREEN_CHILD_EXIT_WITH__EXIT") == NULL)
#endif
        exit(EXIT_SUCCESS);
    else
        _exit(EXIT_SUCCESS);
}